

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::BoundCaseCheck>
          (Serializer *this,vector<duckdb::BoundCaseCheck,_true> *vec)

{
  pointer pBVar1;
  BoundCaseCheck *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ).
                        super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ).
                        super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  pBVar1 = (vec->super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
               super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
               _M_impl.super__Vector_impl_data._M_start; value != pBVar1; value = value + 1) {
    WriteValue<duckdb::BoundCaseCheck>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}